

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O0

void __thiscall
duckdb::StandardColumnWriter<int,_int,_duckdb::ParquetCastOperator>::FlushPageState
          (StandardColumnWriter<int,_int,_duckdb::ParquetCastOperator> *this,
          WriteStream *temp_writer,ColumnWriterPageState *state_p)

{
  StandardWriterPageState<int,_int,_duckdb::ParquetCastOperator> *pSVar1;
  ClientContext *pCVar2;
  InternalException *this_00;
  long in_RDI;
  StandardWriterPageState<int,_int,_duckdb::ParquetCastOperator> *page_state;
  undefined7 in_stack_ffffffffffffff48;
  uchar in_stack_ffffffffffffff4f;
  RleBpEncoder *in_stack_ffffffffffffff50;
  WriteStream *in_stack_ffffffffffffff58;
  allocator *paVar3;
  DlbaEncoder *in_stack_ffffffffffffff60;
  Allocator *in_stack_ffffffffffffff68;
  BssEncoder *in_stack_ffffffffffffff70;
  WriteStream *in_stack_ffffffffffffff98;
  DbpEncoder *in_stack_ffffffffffffffa0;
  Allocator *in_stack_ffffffffffffffa8;
  DlbaEncoder *in_stack_ffffffffffffffb0;
  
  pSVar1 = ColumnWriterPageState::
           Cast<duckdb::StandardWriterPageState<int,int,duckdb::ParquetCastOperator>>
                     ((ColumnWriterPageState *)in_stack_ffffffffffffff50);
  switch(pSVar1->encoding) {
  case PLAIN:
    break;
  default:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    paVar3 = (allocator *)&stack0xffffffffffffffa7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xffffffffffffffa8,"Unknown encoding",paVar3);
    duckdb::InternalException::InternalException(this_00,(string *)&stack0xffffffffffffffa8);
    __cxa_throw(this_00,&InternalException::typeinfo,InternalException::~InternalException);
  case DELTA_BINARY_PACKED:
    if ((pSVar1->dbp_initialized & 1U) == 0) {
      DbpEncoder::BeginWrite<int>
                (&in_stack_ffffffffffffff60->dbp_encoder,in_stack_ffffffffffffff58,
                 (int32_t *)in_stack_ffffffffffffff50);
    }
    DbpEncoder::FinishWrite(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    break;
  case DELTA_LENGTH_BYTE_ARRAY:
    if ((pSVar1->dlba_initialized & 1U) == 0) {
      pCVar2 = ParquetWriter::GetContext(*(ParquetWriter **)(in_RDI + 8));
      duckdb::BufferAllocator::Get(pCVar2);
      string_t::string_t((string_t *)in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
      DlbaEncoder::BeginWrite<duckdb::string_t>
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                 (WriteStream *)in_stack_ffffffffffffffa0,(string_t *)in_stack_ffffffffffffff98);
    }
    DlbaEncoder::FinishWrite(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    break;
  case RLE_DICTIONARY:
    if ((pSVar1->dict_written_value & 1U) == 0) {
      WriteStream::Write<unsigned_char>
                ((WriteStream *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4f);
    }
    else {
      RleBpEncoder::FinishWrite
                (in_stack_ffffffffffffff50,
                 (WriteStream *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    }
    break;
  case BYTE_STREAM_SPLIT:
    if ((pSVar1->bss_initialized & 1U) == 0) {
      in_stack_ffffffffffffff60 = (DlbaEncoder *)&pSVar1->bss_encoder;
      pCVar2 = ParquetWriter::GetContext(*(ParquetWriter **)(in_RDI + 8));
      duckdb::BufferAllocator::Get(pCVar2);
      BssEncoder::BeginWrite(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    }
    BssEncoder::FinishWrite((BssEncoder *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  return;
}

Assistant:

void FlushPageState(WriteStream &temp_writer, ColumnWriterPageState *state_p) override {
		auto &page_state = state_p->Cast<StandardWriterPageState<SRC, TGT, OP>>();
		switch (page_state.encoding) {
		case duckdb_parquet::Encoding::DELTA_BINARY_PACKED:
			if (!page_state.dbp_initialized) {
				page_state.dbp_encoder.BeginWrite(temp_writer, 0);
			}
			page_state.dbp_encoder.FinishWrite(temp_writer);
			break;
		case duckdb_parquet::Encoding::RLE_DICTIONARY:
			D_ASSERT(page_state.dict_bit_width != 0);
			if (!page_state.dict_written_value) {
				// all values are null
				// just write the bit width
				temp_writer.Write<uint8_t>(page_state.dict_bit_width);
				return;
			}
			page_state.dict_encoder.FinishWrite(temp_writer);
			break;
		case duckdb_parquet::Encoding::DELTA_LENGTH_BYTE_ARRAY:
			if (!page_state.dlba_initialized) {
				page_state.dlba_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()), temp_writer,
				                                   string_t(""));
			}
			page_state.dlba_encoder.FinishWrite(temp_writer);
			break;
		case duckdb_parquet::Encoding::BYTE_STREAM_SPLIT:
			if (!page_state.bss_initialized) {
				page_state.bss_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()));
			}
			page_state.bss_encoder.FinishWrite(temp_writer);
			break;
		case duckdb_parquet::Encoding::PLAIN:
			break;
		default:
			throw InternalException("Unknown encoding");
		}
	}